

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::SetFrontFace(GLContextState *this,bool FrontCounterClockwise)

{
  ENABLE_STATE EVar1;
  undefined7 in_register_00000031;
  GLenum err;
  string msg;
  
  EVar1 = DISABLED - (int)CONCAT71(in_register_00000031,FrontCounterClockwise);
  if ((this->m_RSState).FrontCounterClockwise.m_EnableState != EVar1) {
    glFrontFace();
    err = glGetError();
    if (err != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"SetFrontFace",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x27a,(char (*) [25])"Failed to set front face",(char (*) [17])"\nGL Error Code: "
                 ,&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetFrontFace",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x27a);
      std::__cxx11::string::~string((string *)&msg);
    }
    (this->m_RSState).FrontCounterClockwise.m_EnableState = EVar1;
  }
  return;
}

Assistant:

void GLContextState::SetFrontFace(bool FrontCounterClockwise)
{
    if (m_RSState.FrontCounterClockwise != FrontCounterClockwise)
    {
        GLenum FrontFace = FrontCounterClockwise ? GL_CCW : GL_CW;
        glFrontFace(FrontFace);
        DEV_CHECK_GL_ERROR("Failed to set front face");
        m_RSState.FrontCounterClockwise = FrontCounterClockwise;
    }
}